

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O1

void __thiscall
EthBasePort::EthBasePort
          (EthBasePort *this,int portNum,bool forceFwBridge,ostream *debugStream,EthCallbackType cb)

{
  BasePort::BasePort(&this->super_BasePort,portNum,debugStream);
  (this->super_BasePort)._vptr_BasePort = (_func_int **)&PTR___cxa_pure_virtual_00123b10;
  this->useFwBridge = forceFwBridge;
  this->fw_tl = '\0';
  this->eth_read_callback = cb;
  this->ReceiveTimeout = 0.02;
  (this->FpgaStatus).srcPort = 0;
  (this->FpgaStatus).numStateInvalid = 0;
  (this->FpgaStatus).numPacketError = 0;
  (this->FpgaStatus).FwBusReset = false;
  (this->FpgaStatus).FwPacketDropped = false;
  (this->FpgaStatus).EthInternalError = false;
  (this->FpgaStatus).EthSummaryError = false;
  (this->FpgaStatus).noForwardFlag = false;
  return;
}

Assistant:

EthBasePort::EthBasePort(int portNum, bool forceFwBridge, std::ostream &debugStream, EthCallbackType cb):
    BasePort(portNum, debugStream),
    useFwBridge(forceFwBridge),
    fw_tl(0),
    eth_read_callback(cb),
    ReceiveTimeout(0.02)
{
}